

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

ssize_t http_decode_path_unsafe(char *dest,char *url_data)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  char *pos;
  byte bVar5;
  
  lVar4 = 0;
  do {
    cVar1 = *url_data;
    if (cVar1 == '%') {
      bVar2 = url_data[1];
      bVar5 = bVar2 - 0x30;
      if (9 < bVar5) {
        if (0x25 < bVar2 - 0x41) {
          return -1;
        }
        if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
          return -1;
        }
        bVar5 = bVar2 + 0xa9;
      }
      dest[lVar4] = bVar5 << 4;
      bVar2 = url_data[2];
      bVar3 = bVar2 - 0x30;
      if (9 < bVar3) {
        if (0x25 < bVar2 - 0x41) {
          return -1;
        }
        if ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) == 0) {
          return -1;
        }
        bVar3 = (bVar2 | 0x20) + 0xa9;
      }
      dest[lVar4] = bVar3 | bVar5 << 4;
      url_data = url_data + 3;
    }
    else {
      if (cVar1 == '\0') {
        dest[lVar4] = '\0';
        return lVar4;
      }
      url_data = url_data + 1;
      dest[lVar4] = cVar1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

ssize_t http_decode_path_unsafe(char *dest, const char *url_data) {
  char *pos = dest;
  while (*url_data) {
    if (*url_data == '%') {
      // decode hex value
      // this is a percent encoded value.
      if (hex2byte((uint8_t *)pos, (uint8_t *)&url_data[1]))
        return -1;
      pos++;
      url_data += 3;
    } else
      *(pos++) = *(url_data++);
  }
  *pos = 0;
  return pos - dest;
}